

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBridge.c
# Opt level: O0

DdNode * addBddDoIthBit(DdManager *dd,DdNode *f,DdNode *index)

{
  DdHalfWord index_00;
  DdNode *T_00;
  DdNode *pDVar1;
  DdNode *local_70;
  DdNode *local_68;
  int v;
  int value;
  int mask;
  DdNode *fvn;
  DdNode *fv;
  DdNode *E;
  DdNode *T;
  DdNode *res;
  DdNode *index_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if (f->index == 0x7fffffff) {
    dd_local = (DdManager *)
               ((ulong)dd->one ^
               (long)(int)(uint)(((int)(f->type).value &
                                 1 << ((byte)(int)(index->type).value & 0x1f)) == 0));
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2(dd,addBddDoIthBit,f,index);
    if (dd_local == (DdManager *)0x0) {
      index_00 = f->index;
      pDVar1 = (f->type).kids.E;
      T_00 = addBddDoIthBit(dd,(f->type).kids.T,index);
      if (T_00 == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + 1;
        pDVar1 = addBddDoIthBit(dd,pDVar1,index);
        if (pDVar1 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,T_00);
          dd_local = (DdManager *)0x0;
        }
        else {
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
          if (((ulong)T_00 & 1) == 0) {
            local_70 = T_00;
            if (T_00 != pDVar1) {
              local_70 = cuddUniqueInter(dd,index_00,T_00,pDVar1);
            }
            T = local_70;
            if (local_70 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,T_00);
              Cudd_RecursiveDeref(dd,pDVar1);
              return (DdNode *)0x0;
            }
          }
          else {
            if (T_00 == pDVar1) {
              local_68 = (DdNode *)((ulong)T_00 ^ 1);
            }
            else {
              local_68 = cuddUniqueInter(dd,index_00,(DdNode *)((ulong)T_00 ^ 1),
                                         (DdNode *)((ulong)pDVar1 ^ 1));
            }
            if (local_68 == (DdNode *)0x0) {
              Cudd_RecursiveDeref(dd,T_00);
              Cudd_RecursiveDeref(dd,pDVar1);
              return (DdNode *)0x0;
            }
            T = (DdNode *)((ulong)local_68 ^ 1);
          }
          *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)T_00 & 0xfffffffffffffffe) + 4) + -1;
          *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
          cuddCacheInsert2(dd,addBddDoIthBit,f,index,T);
          dd_local = (DdManager *)T;
        }
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

static DdNode *
addBddDoIthBit(
  DdManager * dd,
  DdNode * f,
  DdNode * index)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int mask, value;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        mask = 1 << ((int) cuddV(index));
        value = (int) cuddV(f);
        return(Cudd_NotCond(DD_ONE(dd),(value & mask) == 0));
    }

    /* Check cache. */
    res = cuddCacheLookup2(dd,addBddDoIthBit,f,index);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addBddDoIthBit(dd,fv,index);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addBddDoIthBit(dd,fvn,index);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);
    if (Cudd_IsComplement(T)) {
        res = (T == E) ? Cudd_Not(T) : cuddUniqueInter(dd,v,Cudd_Not(T),Cudd_Not(E));
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
        res = Cudd_Not(res);
    } else {
        res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, T);
            Cudd_RecursiveDeref(dd, E);
            return(NULL);
        }
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,addBddDoIthBit,f,index,res);

    return(res);

}